

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,int32_t elem,int32_t index,UErrorCode *status)

{
  UBool UVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar1 = ensureCapacity(this,this->count + 1,status), UVar1 != '\0')) {
    uVar3 = (ulong)(uint)this->count;
    uVar2 = (ulong)(uint)index;
    if (index < this->count) {
      do {
        this->elements[uVar3] = this->elements[uVar3 - 1];
        uVar3 = uVar3 - 1;
      } while ((long)uVar2 < (long)uVar3);
    }
    this->elements[uVar2].pointer = (void *)0x0;
    this->elements[uVar2].integer = elem;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::insertElementAt(int32_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = NULL;
        elements[index].integer = elem;
        ++count;
    }
    /* else index out of range */
}